

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::AddExtensionGenerators
          (MessageGenerator *this,
          vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
          *extension_generators)

{
  long lVar1;
  bool bVar2;
  Descriptor *pDVar3;
  ExtensionGenerator *this_00;
  long lVar4;
  long lVar5;
  GenerationOptions *generation_options;
  string_view root_or_message_class_name;
  _Head_base<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_false> local_50;
  vector<google::protobuf::compiler::objectivec::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_const*>>
  *local_48;
  MessageGenerator *local_40;
  long local_38;
  
  pDVar3 = this->descriptor_;
  if (0 < *(int *)(pDVar3 + 0x8c)) {
    local_48 = (vector<google::protobuf::compiler::objectivec::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_const*>>
                *)&this->extension_generators_;
    lVar5 = 0;
    lVar4 = 0;
    local_40 = this;
    do {
      lVar1 = *(long *)(pDVar3 + 0x60);
      generation_options = this->generation_options_;
      if (generation_options->strip_custom_options == true) {
        bVar2 = ExtensionIsCustomOption((FieldDescriptor *)(lVar1 + lVar5));
        if (!bVar2) {
          generation_options = this->generation_options_;
          goto LAB_002d5d55;
        }
      }
      else {
LAB_002d5d55:
        local_38 = lVar5;
        this_00 = (ExtensionGenerator *)operator_new(0x50);
        root_or_message_class_name._M_str = (this->class_name_)._M_dataplus._M_p;
        root_or_message_class_name._M_len = (this->class_name_)._M_string_length;
        ExtensionGenerator::ExtensionGenerator
                  (this_00,root_or_message_class_name,(FieldDescriptor *)(lVar1 + lVar5),
                   generation_options);
        local_50._M_head_impl = this_00;
        std::
        vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>>>
        ::
        emplace_back<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>>
                  ((vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>>>>
                    *)extension_generators,
                   (unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                    *)&local_50);
        std::
        unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
        ::~unique_ptr((unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                       *)&local_50);
        local_50._M_head_impl =
             (extension_generators->
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
             .
             super__Head_base<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_false>
             ._M_head_impl;
        std::
        vector<google::protobuf::compiler::objectivec::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_const*>>
        ::emplace_back<google::protobuf::compiler::objectivec::ExtensionGenerator_const*>
                  (local_48,&local_50._M_head_impl);
        lVar5 = local_38;
        this = local_40;
      }
      lVar4 = lVar4 + 1;
      pDVar3 = this->descriptor_;
      lVar5 = lVar5 + 0x58;
    } while (lVar4 < *(int *)(pDVar3 + 0x8c));
  }
  return;
}

Assistant:

void MessageGenerator::AddExtensionGenerators(
    std::vector<std::unique_ptr<ExtensionGenerator>>* extension_generators) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    const FieldDescriptor* extension = descriptor_->extension(i);
    if (!generation_options_.strip_custom_options ||
        !ExtensionIsCustomOption(extension)) {
      extension_generators->push_back(std::make_unique<ExtensionGenerator>(
          class_name_, extension, generation_options_));
      extension_generators_.push_back(extension_generators->back().get());
    }
  }
}